

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O2

base_learner * marginal_setup(options_i *options,vw *all)

{
  int iVar1;
  typed_option<float> *ptVar2;
  long lVar3;
  base_learner *l;
  single_learner *base;
  learner<MARGINAL::data,_example> *plVar4;
  size_t u;
  long lVar5;
  free_ptr<MARGINAL::data> d;
  option_group_definition marginal_options;
  string marginal;
  allocator local_252;
  allocator local_251;
  string local_250 [32];
  free_ptr<MARGINAL::data> local_230;
  undefined1 local_220 [112];
  bool local_1b0;
  option_group_definition local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  scoped_calloc_or_throw<MARGINAL::data>();
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_48,"VW options",(allocator *)local_220);
  VW::config::option_group_definition::option_group_definition(&local_180,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_68,"marginal",&local_251);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_220,&local_68,&local_148);
  local_1b0 = true;
  std::__cxx11::string::string(local_250,"substitute marginal label estimates for ids",&local_252);
  std::__cxx11::string::_M_assign((string *)(local_220 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_180,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_220);
  std::__cxx11::string::~string(local_250);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_220);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_88,"initial_denominator",&local_251);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_220,&local_88,
             &(local_230._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_MARGINAL::data_*,_false>._M_head_impl)->initial_denominator);
  ptVar2 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_220,1.0);
  std::__cxx11::string::string(local_250,"initial denominator",&local_252);
  std::__cxx11::string::_M_assign((string *)&(ptVar2->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(&local_180,ptVar2);
  std::__cxx11::string::~string(local_250);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_220);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_a8,"initial_numerator",&local_251);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_220,&local_a8,
             &(local_230._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_MARGINAL::data_*,_false>._M_head_impl)->initial_numerator);
  ptVar2 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_220,0.5);
  std::__cxx11::string::string(local_250,"initial numerator",&local_252);
  std::__cxx11::string::_M_assign((string *)&(ptVar2->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(&local_180,ptVar2);
  std::__cxx11::string::~string(local_250);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_220);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"compete",&local_251);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_220,&local_c8,
             &(local_230._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_MARGINAL::data_*,_false>._M_head_impl)->compete);
  std::__cxx11::string::string(local_250,"enable competition with marginal features",&local_252);
  std::__cxx11::string::_M_assign((string *)(local_220 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_180,(typed_option<bool> *)local_220);
  std::__cxx11::string::~string(local_250);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_220);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string((string *)&local_e8,"update_before_learn",&local_251);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_220,&local_e8,
             &(local_230._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_MARGINAL::data_*,_false>._M_head_impl)->update_before_learn);
  std::__cxx11::string::string(local_250,"update marginal values before learning",&local_252);
  std::__cxx11::string::_M_assign((string *)(local_220 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_180,(typed_option<bool> *)local_220);
  std::__cxx11::string::~string(local_250);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_220);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string((string *)&local_108,"unweighted_marginals",&local_251);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_220,&local_108,
             &(local_230._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_MARGINAL::data_*,_false>._M_head_impl)->unweighted_marginals);
  std::__cxx11::string::string
            (local_250,"ignore importance weights when computing marginals",&local_252);
  std::__cxx11::string::_M_assign((string *)(local_220 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_180,(typed_option<bool> *)local_220);
  std::__cxx11::string::~string(local_250);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_220);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string((string *)&local_128,"decay",&local_251);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_220,&local_128,
             &(local_230._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_MARGINAL::data_*,_false>._M_head_impl)->decay);
  ptVar2 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_220,0.0);
  std::__cxx11::string::string(local_250,"decay multiplier per event (1e-3 for example)",&local_252)
  ;
  std::__cxx11::string::_M_assign((string *)&(ptVar2->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(&local_180,ptVar2);
  std::__cxx11::string::~string(local_250);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_220);
  std::__cxx11::string::~string((string *)&local_128);
  (**options->_vptr_options_i)(options,&local_180);
  std::__cxx11::string::string((string *)local_220,"marginal",(allocator *)local_250);
  iVar1 = (*options->_vptr_options_i[1])(options,local_220);
  std::__cxx11::string::~string((string *)local_220);
  if ((char)iVar1 == '\0') {
    plVar4 = (learner<MARGINAL::data,_example> *)0x0;
  }
  else {
    (local_230._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_MARGINAL::data_*,_false>._M_head_impl)->all = all;
    for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
      lVar3 = std::__cxx11::string::find((char)&local_148,(ulong)(uint)(int)(char)lVar5);
      if (lVar3 != -1) {
        (local_230._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_MARGINAL::data_*,_false>._M_head_impl)->id_features[lVar5] = true;
      }
    }
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar4 = LEARNER::init_learner<MARGINAL::data,example,LEARNER::learner<char,example>>
                       (&local_230,base,MARGINAL::predict_or_learn<true>,
                        MARGINAL::predict_or_learn<false>);
    *(undefined8 *)(plVar4 + 0xb8) = *(undefined8 *)(plVar4 + 0x18);
    *(undefined8 *)(plVar4 + 0xc0) = *(undefined8 *)(plVar4 + 0x20);
    *(code **)(plVar4 + 200) = MARGINAL::finish;
    *(code **)(plVar4 + 0x80) = MARGINAL::save_load;
    *(undefined8 *)(plVar4 + 0x70) = *(undefined8 *)(plVar4 + 0x18);
    *(undefined8 *)(plVar4 + 0x78) = *(undefined8 *)(plVar4 + 0x20);
  }
  VW::config::option_group_definition::~option_group_definition(&local_180);
  std::__cxx11::string::~string((string *)&local_148);
  std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::~unique_ptr(&local_230);
  return (base_learner *)plVar4;
}

Assistant:

LEARNER::base_learner* marginal_setup(options_i& options, vw& all)
{
  free_ptr<MARGINAL::data> d = scoped_calloc_or_throw<MARGINAL::data>();
  std::string marginal;

  option_group_definition marginal_options("VW options");
  marginal_options.add(make_option("marginal", marginal).keep().help("substitute marginal label estimates for ids"));
  marginal_options.add(
      make_option("initial_denominator", d->initial_denominator).default_value(1.f).help("initial denominator"));
  marginal_options.add(
      make_option("initial_numerator", d->initial_numerator).default_value(0.5f).help("initial numerator"));
  marginal_options.add(make_option("compete", d->compete).help("enable competition with marginal features"));
  marginal_options.add(
      make_option("update_before_learn", d->update_before_learn).help("update marginal values before learning"));
  marginal_options.add(make_option("unweighted_marginals", d->unweighted_marginals)
                           .help("ignore importance weights when computing marginals"));
  marginal_options.add(
      make_option("decay", d->decay).default_value(0.f).help("decay multiplier per event (1e-3 for example)"));
  options.add_and_parse(marginal_options);

  if (!options.was_supplied("marginal"))
  {
    return nullptr;
  }

  d->all = &all;

  for (size_t u = 0; u < 256; u++)
    if (marginal.find((char)u) != string::npos)
      d->id_features[u] = true;

  LEARNER::learner<MARGINAL::data, example>& ret =
      init_learner(d, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);
  ret.set_finish(finish);
  ret.set_save_load(save_load);

  return make_base(ret);
}